

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManCSPassiveClauseContainer.cpp
# Opt level: O2

Clause * __thiscall
Saturation::ManCSPassiveClauseContainer::popSelected(ManCSPassiveClauseContainer *this)

{
  Clause *t;
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  pointer ppCVar5;
  const_iterator __position;
  bool bVar6;
  string id;
  
  do {
    std::operator<<((ostream *)&std::cout,"Pick a clause:\n");
    id._M_dataplus._M_p = (pointer)&id.field_2;
    id._M_string_length = 0;
    id.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&std::cin,(string *)&id);
    uVar1 = std::__cxx11::stoi(&id,(size_t *)0x0,10);
    ppCVar5 = (this->clauses).
              super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    __position._M_current =
         (this->clauses).super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    lVar3 = (long)__position._M_current - (long)ppCVar5;
    for (lVar4 = lVar3 >> 5; 0 < lVar4; lVar4 = lVar4 + -1) {
      if (((*ppCVar5)->super_Unit)._number == uVar1) goto LAB_005036c9;
      if ((ppCVar5[1]->super_Unit)._number == uVar1) {
        ppCVar5 = ppCVar5 + 1;
        goto LAB_005036c9;
      }
      if ((ppCVar5[2]->super_Unit)._number == uVar1) {
        ppCVar5 = ppCVar5 + 2;
        goto LAB_005036c9;
      }
      if ((ppCVar5[3]->super_Unit)._number == uVar1) {
        ppCVar5 = ppCVar5 + 3;
        goto LAB_005036c9;
      }
      ppCVar5 = ppCVar5 + 4;
      lVar3 = lVar3 + -0x20;
    }
    lVar3 = lVar3 >> 3;
    if (lVar3 == 1) {
LAB_005036ad:
      if (((*ppCVar5)->super_Unit)._number != uVar1) {
        ppCVar5 = __position._M_current;
      }
LAB_005036c9:
      bVar6 = ppCVar5 == __position._M_current;
      __position._M_current = ppCVar5;
      if (bVar6) goto LAB_005036d6;
      bVar6 = false;
    }
    else {
      if (lVar3 == 2) {
LAB_005036a1:
        if (((*ppCVar5)->super_Unit)._number != uVar1) {
          ppCVar5 = ppCVar5 + 1;
          goto LAB_005036ad;
        }
        goto LAB_005036c9;
      }
      if (lVar3 == 3) {
        if (((*ppCVar5)->super_Unit)._number != uVar1) {
          ppCVar5 = ppCVar5 + 1;
          goto LAB_005036a1;
        }
        goto LAB_005036c9;
      }
LAB_005036d6:
      poVar2 = std::operator<<((ostream *)&std::cout,"User error: No clause in Passive has id ");
      poVar2 = std::operator<<(poVar2,(string *)&id);
      bVar6 = true;
      std::operator<<(poVar2,"!\n");
    }
    std::__cxx11::string::~string((string *)&id);
    if (!bVar6) {
      t = *__position._M_current;
      std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>::erase
                (&this->clauses,__position);
      Lib::SingleParamEvent<Kernel::Clause_*>::fire
                (&(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
                  super_ClauseContainer.selectedEvent,t);
      return t;
    }
  } while( true );
}

Assistant:

Clause* ManCSPassiveClauseContainer::popSelected()
{
  ASS(!clauses.empty());

  std::vector<Clause*>::iterator selectedClauseIt;
  while(true)
  {
    // ask user to pick a clause id
    std::cout << "Pick a clause:\n";
    std::string id;
    std::cin >> id;
    unsigned selectedId = std::stoi(id);

    // search clause with that id
    selectedClauseIt = std::find_if(clauses.begin(), clauses.end(), 
      [&](Clause* c) -> bool { return c->number() == selectedId; });
    if(selectedClauseIt != clauses.end())
    {
      break;
    }
    else
    {
      std::cout << "User error: No clause in Passive has id " << id << "!\n";
    }
  }

  auto selectedClause	= *selectedClauseIt;
  clauses.erase(selectedClauseIt);
  selectedEvent.fire(selectedClause);

  return selectedClause;
}